

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_F26Dot6 Round_To_Half_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_Int color)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = (exc->tt_metrics).compensations[color];
  if (-1 < distance) {
    uVar2 = lVar1 + distance;
    uVar3 = 0x20;
    if (-1 < (long)uVar2) {
      uVar3 = uVar2 & 0xffffffffffffffc0 | 0x20;
    }
    return uVar3;
  }
  uVar2 = lVar1 - distance & 0xffffffffffffffc0;
  uVar3 = 0xffffffffffffffe0;
  if (-0x21 < (long)uVar2) {
    uVar3 = uVar2 ^ 0xffffffffffffffe0;
  }
  return uVar3;
}

Assistant:

static FT_F26Dot6
  Round_To_Half_Grid( TT_ExecContext  exc,
                      FT_F26Dot6      distance,
                      FT_Int          color )
  {
    FT_F26Dot6  compensation = exc->tt_metrics.compensations[color];
    FT_F26Dot6  val;


    if ( distance >= 0 )
    {
      val = ADD_LONG( FT_PIX_FLOOR( ADD_LONG( distance, compensation ) ),
                      32 );
      if ( val < 0 )
        val = 32;
    }
    else
    {
      val = NEG_LONG( ADD_LONG( FT_PIX_FLOOR( SUB_LONG( compensation,
                                                        distance ) ),
                                32 ) );
      if ( val > 0 )
        val = -32;
    }

    return val;
  }